

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_freeDDict(ZSTD_DDict *ddict)

{
  ZSTD_customMem customMem;
  ZSTD_customMem cMem;
  ZSTD_DDict *ddict_local;
  
  if (ddict != (ZSTD_DDict *)0x0) {
    customMem = ddict->cMem;
    ZSTD_free(ddict->dictBuffer,ddict->cMem);
    ZSTD_free(ddict,customMem);
  }
  return 0;
}

Assistant:

size_t ZSTD_freeDDict(ZSTD_DDict* ddict)
{
    if (ddict==NULL) return 0;   /* support free on NULL */
    {   ZSTD_customMem const cMem = ddict->cMem;
        ZSTD_free(ddict->dictBuffer, cMem);
        ZSTD_free(ddict, cMem);
        return 0;
    }
}